

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

NodeData * __thiscall c4::yml::Parser::_append_key_val_null(Parser *this,char *str)

{
  char *pcVar1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  NodeData *pNVar5;
  char msg [59];
  char local_48 [64];
  
  pcVar1 = (this->m_buf).str;
  if ((str < pcVar1) || (pcVar1 + (this->m_buf).len < str)) {
    builtin_strncpy(local_48 + 0x30,"buf.end())",0xb);
    builtin_strncpy(local_48 + 0x20,"n() && str <= m_",0x10);
    builtin_strncpy(local_48 + 0x10,"tr >= m_buf.begi",0x10);
    builtin_strncpy(local_48,"check failed: (s",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar2 = (code *)swi(3);
        pNVar5 = (NodeData *)(*pcVar2)();
        return pNVar5;
      }
    }
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x5e96) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x5e96) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_48,0x3b,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  pNVar5 = _append_key_val(this,(csubstr)ZEXT816(0),0);
  return pNVar5;
}

Assistant:

inline NodeData* _append_key_val_null(const char *str) { _RYML_CB_ASSERT(m_stack.m_callbacks, str >= m_buf.begin() && str <= m_buf.end()); return _append_key_val({nullptr, size_t(0)}); }